

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O3

bool operator==(SettingsValue *a,SettingsValue *b)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  size_type *local_58;
  _Alloc_hider local_50;
  size_type local_48 [2];
  undefined8 local_38;
  _Alloc_hider local_30;
  pointer local_28;
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xffffffffffffffc8,(int)a,(void *)0x0,0);
  UniValue::write_abi_cxx11_((UniValue *)&local_58,(int)b,(void *)0x0,0);
  if (local_30._M_p == local_50._M_p) {
    if ((pointer)local_30._M_p == (pointer)0x0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((void *)local_38,local_58,(size_t)local_30._M_p);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((pointer *)local_38 != &stack0xffffffffffffffd8) {
    operator_delete((void *)local_38,(ulong)((long)&(local_28->_M_dataplus)._M_p + 1));
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == (pointer)local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline bool operator==(const common::SettingsValue& a, const common::SettingsValue& b)
{
    return a.write() == b.write();
}